

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoch_tracker.cc
# Opt level: O3

bool __thiscall sptk::reaper::EpochTracker::ComputePolarity(EpochTracker *this,int *polarity)

{
  bool bVar1;
  EpochTracker *this_00;
  float local_24;
  
  if (this->sample_rate_ <= 0.0) {
    ComputePolarity();
  }
  else {
    bVar1 = GetBandpassedRmsSignal
                      (this,&this->signal_,this->sample_rate_,this->min_freq_for_rms_,
                       this->max_freq_for_rms_,this->internal_frame_interval_,this->rms_window_dur_,
                       &this->bandpassed_rms_);
    if (bVar1) {
      this_00 = this;
      bVar1 = GetLpcResidual(this,&this->signal_,this->sample_rate_,&this->residual_);
      if (bVar1) {
        GetSymmetryStats(this_00,&this->residual_,&this->positive_rms_,&this->negative_rms_,
                         &local_24);
        *polarity = -1;
        if (this->negative_rms_ <= this->positive_rms_ && this->positive_rms_ != this->negative_rms_
           ) {
          *polarity = 1;
        }
        return true;
      }
      ComputePolarity();
    }
    else {
      ComputePolarity();
    }
  }
  return false;
}

Assistant:

bool EpochTracker::ComputePolarity(int *polarity) {
  if (sample_rate_ <= 0.0) {
    fprintf(stderr, "EpochTracker not initialized in ComputeFeatures\n");
    return false;
  }
  if (!GetBandpassedRmsSignal(signal_, sample_rate_, min_freq_for_rms_,
                              max_freq_for_rms_, internal_frame_interval_,
                              rms_window_dur_, &bandpassed_rms_)) {
    fprintf(stderr, "Failure in GetBandpassedRmsSignal\n");
    return false;
  }
  if (!GetLpcResidual(signal_, sample_rate_, &residual_)) {
    fprintf(stderr, "Failure in GetLpcResidual\n");
    return false;
  }
  float mean = 0.0;
  GetSymmetryStats(residual_, &positive_rms_, &negative_rms_, &mean);
  *polarity = -1;
  if (positive_rms_ > negative_rms_) {
    *polarity = 1;
  }
  return true;
}